

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fLifetimeTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::anon_unknown_0::TestGroup::init(TestGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  ES2Types *pEVar2;
  int extraout_EAX;
  ES2Types *this_00;
  Context ltCtx;
  Context local_28;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_28.m_testCtx = pCVar1->m_testCtx;
  local_28.m_renderCtx = pCVar1->m_renderCtx;
  this_00 = (ES2Types *)operator_new(0x5e8);
  deqp::gls::LifetimeTests::details::ES2Types::ES2Types(this_00,&local_28);
  pEVar2 = (ES2Types *)
           (this->m_types).
           super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
           .m_data.ptr;
  if (pEVar2 != this_00) {
    if (pEVar2 != (ES2Types *)0x0) {
      (*(pEVar2->super_Types)._vptr_Types[2])();
      (this->m_types).
      super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
      .m_data.ptr = (Types *)0x0;
    }
    (this->m_types).
    super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
    .m_data.ptr = (Types *)this_00;
  }
  deqp::gls::LifetimeTests::details::addTestCases
            ((TestCaseGroup *)this,
             (this->m_types).
             super_UniqueBase<deqp::gls::LifetimeTests::details::Types,_de::DefaultDeleter<deqp::gls::LifetimeTests::details::Types>_>
             .m_data.ptr);
  return extraout_EAX;
}

Assistant:

void TestGroup::init (void)
{
	gles2::Context&	ctx		= getContext();
	lt::Context		ltCtx	(ctx.getRenderContext(), ctx.getTestContext());

	m_types = MovePtr<Types>(new ES2Types(ltCtx));
	addTestCases(*this, *m_types);
}